

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::CallIndirect::finalize(CallIndirect *this)

{
  bool bVar1;
  Type local_38;
  BasicType local_2c;
  Type local_28;
  Signature local_20;
  CallIndirect *local_10;
  CallIndirect *this_local;
  
  local_10 = this;
  local_20 = HeapType::getSignature(&this->heapType);
  (this->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id =
       local_20.results.id;
  handleUnreachableOperands<wasm::CallIndirect>(this);
  if ((this->isReturn & 1U) != 0) {
    wasm::Type::Type(&local_28,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = local_28.id
    ;
  }
  local_2c = unreachable;
  bVar1 = wasm::Type::operator==(&this->target->type,&local_2c);
  if (bVar1) {
    wasm::Type::Type(&local_38,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = local_38.id
    ;
  }
  return;
}

Assistant:

void CallIndirect::finalize() {
  type = heapType.getSignature().results;
  handleUnreachableOperands(this);
  if (isReturn) {
    type = Type::unreachable;
  }
  if (target->type == Type::unreachable) {
    type = Type::unreachable;
  }
}